

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O0

shared_ptr<utils::detail::shared_ptr_continer> __thiscall
utils::detail::weak_ptr_continer_imp<std::weak_ptr<subject>_>::lock
          (weak_ptr_continer_imp<std::weak_ptr<subject>_> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<utils::detail::shared_ptr_continer> sVar1;
  shared_ptr<subject> local_38;
  shared_ptr<subject> local_28;
  weak_ptr_continer_imp<std::weak_ptr<subject>_> *this_local;
  
  this_local = this;
  std::weak_ptr<subject>::lock((weak_ptr<subject> *)&local_38);
  std::
  make_shared<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>>,std::shared_ptr<subject>>
            (&local_28);
  std::shared_ptr<utils::detail::shared_ptr_continer>::
  shared_ptr<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>>,void>
            ((shared_ptr<utils::detail::shared_ptr_continer> *)this,
             (shared_ptr<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>_>_> *)
             &local_28);
  std::shared_ptr<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>_>_>::~shared_ptr
            ((shared_ptr<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>_>_> *)
             &local_28);
  std::shared_ptr<subject>::~shared_ptr(&local_38);
  sVar1.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<utils::detail::shared_ptr_continer>)
         sVar1.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<shared_ptr_continer> lock() const
    {
        using SharedPtrType = typename smart_ptr_traits<WeakPtrType>::share_type;
        return std::make_shared<shared_ptr_continer_imp<SharedPtrType>>(m_weak.lock());
    }